

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtableview.cpp
# Opt level: O2

void QTableView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  PenStyle *pPVar1;
  byte bVar2;
  
  if (_c == WriteProperty) {
    if ((uint)_id < 5) {
      pPVar1 = (PenStyle *)*_a;
      switch(_id) {
      case 1:
        setGridStyle((QTableView *)_o,*pPVar1);
        return;
      case 2:
        setSortingEnabled((QTableView *)_o,SUB41(*pPVar1,0));
        return;
      case 3:
        setWordWrap((QTableView *)_o,SUB41(*pPVar1,0));
        return;
      case 4:
        setCornerButtonEnabled((QTableView *)_o,SUB41(*pPVar1,0));
        return;
      }
switchD_0052fcde_caseD_0:
      setShowGrid((QTableView *)_o,SUB41(*pPVar1,0));
      return;
    }
  }
  else if (_c == ReadProperty) {
    if ((uint)_id < 5) {
      switch(_id) {
      case 0:
        bVar2 = *(byte *)(*(long *)(_o + 8) + 0x540);
        break;
      case 1:
        *(undefined4 *)*_a = *(undefined4 *)(*(long *)(_o + 8) + 0x544);
        return;
      case 2:
        bVar2 = *(byte *)(*(long *)(_o + 8) + 0x640);
        break;
      case 3:
        bVar2 = *(byte *)(*(long *)(_o + 8) + 0x491);
        break;
      case 4:
        bVar2 = ~*(byte *)(*(long *)(*(long *)(*(long *)(_o + 8) + 0x590) + 0x20) + 8) & 1;
      }
      *(byte *)*_a = bVar2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      selectRow((QTableView *)_o,*_a[1]);
      return;
    case 1:
      selectColumn((QTableView *)_o,*_a[1]);
      return;
    case 2:
      hideRow((QTableView *)_o,*_a[1]);
      return;
    case 3:
      hideColumn((QTableView *)_o,*_a[1]);
      return;
    case 4:
      showRow((QTableView *)_o,*_a[1]);
      return;
    case 5:
      showColumn((QTableView *)_o,*_a[1]);
      return;
    case 6:
      resizeRowToContents((QTableView *)_o,*_a[1]);
      return;
    case 7:
      resizeRowsToContents((QTableView *)_o);
      return;
    case 8:
      resizeColumnToContents((QTableView *)_o,*_a[1]);
      return;
    case 9:
      resizeColumnsToContents((QTableView *)_o);
      return;
    case 10:
      sortByColumn((QTableView *)_o,*_a[1],*_a[2]);
      return;
    case 0xb:
      pPVar1 = (PenStyle *)_a[1];
      goto switchD_0052fcde_caseD_0;
    case 0xc:
      rowMoved((QTableView *)_o,0,*_a[2],*_a[3]);
      return;
    case 0xd:
      columnMoved((QTableView *)_o,0,*_a[2],*_a[3]);
      return;
    case 0xe:
      rowResized((QTableView *)_o,*_a[1],0x674220,(int)_a);
      return;
    case 0xf:
      columnResized((QTableView *)_o,*_a[1],0x674220,(int)_a);
      return;
    case 0x10:
      rowCountChanged((QTableView *)_o,*_a[1],*_a[2]);
      return;
    case 0x11:
      FUN_002a1810();
      return;
    }
  }
  return;
}

Assistant:

void QTableView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTableView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->selectRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->selectColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->hideRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->hideColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->showRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->showColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->resizeRowToContents((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->resizeRowsToContents(); break;
        case 8: _t->resizeColumnToContents((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->resizeColumnsToContents(); break;
        case 10: _t->sortByColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::SortOrder>>(_a[2]))); break;
        case 11: _t->setShowGrid((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 12: _t->rowMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 13: _t->columnMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->rowResized((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 15: _t->columnResized((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 16: _t->rowCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 17: _t->columnCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->showGrid(); break;
        case 1: *reinterpret_cast<Qt::PenStyle*>(_v) = _t->gridStyle(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isSortingEnabled(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isCornerButtonEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setShowGrid(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setGridStyle(*reinterpret_cast<Qt::PenStyle*>(_v)); break;
        case 2: _t->setSortingEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setCornerButtonEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}